

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall
TxConfirmStats::removeTx
          (TxConfirmStats *this,uint entryHeight,uint nBestSeenHeight,uint bucketindex,bool inBlock)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  string_view source_file;
  bool bVar5;
  LogFlags category;
  Logger *pLVar6;
  pointer piVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  pointer pvVar12;
  pointer args_1;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  char *in_stack_ffffffffffffff00;
  uint *in_stack_ffffffffffffff08;
  uint blockIndex;
  uint bucketindex_local;
  string local_70;
  string log_msg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = nBestSeenHeight - entryHeight;
  if (nBestSeenHeight == 0) {
    uVar10 = 0;
  }
  bucketindex_local = bucketindex;
  if ((int)uVar10 < 0) {
    bVar5 = ::LogAcceptCategory((LogFlags)this,entryHeight);
    if (bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_00._M_len = 0x58;
        logging_function_00._M_str = "removeTx";
        logging_function_00._M_len = 8;
        ::LogPrintf_<>(logging_function_00,source_file_00,0x1e8,ESTIMATEFEE,Debug,
                       "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;
      }
      goto LAB_007c1ea2;
    }
  }
  else {
    args_1 = (this->unconfTxs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    category = ((long)(this->unconfTxs).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)args_1) / 0x18;
    if ((int)uVar10 < (int)category) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = category;
      blockIndex = SUB164(ZEXT416(entryHeight) % auVar4,0);
      piVar7 = *(pointer *)
                &args_1[SUB168(ZEXT416(entryHeight) % auVar4,0)].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl;
      iVar9 = piVar7[bucketindex];
      if (iVar9 < 1) {
        bVar5 = ::LogAcceptCategory(category,entryHeight);
        if (bVar5) {
          pLVar6 = LogInstance();
          bVar5 = BCLog::Logger::Enabled(pLVar6);
          if (bVar5) {
            log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
            log_msg._M_string_length = 0;
            log_msg.field_2._M_local_buf[0] = '\0';
            tinyformat::format<unsigned_int,unsigned_int>
                      (&local_70,
                       (tinyformat *)
                       "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n"
                       ,(char *)&blockIndex,&bucketindex_local,(uint *)args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&log_msg,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            pLVar6 = LogInstance();
            local_70._M_dataplus._M_p = &DAT_00000058;
            local_70._M_string_length = 0xccc4d7;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
            ;
            source_file._M_len = 0x58;
            str._M_str = log_msg._M_dataplus._M_p;
            str._M_len = log_msg._M_string_length;
            logging_function._M_str = "removeTx";
            logging_function._M_len = 8;
            BCLog::Logger::LogPrintStr
                      (pLVar6,str,logging_function,source_file,0x1fa,ESTIMATEFEE,Debug);
            std::__cxx11::string::~string((string *)&log_msg);
          }
        }
      }
      else {
LAB_007c1c6e:
        piVar7[bucketindex] = iVar9 + -1;
      }
    }
    else {
      piVar7 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar7[bucketindex];
      if (0 < iVar9) goto LAB_007c1c6e;
      bVar5 = ::LogAcceptCategory(category,entryHeight);
      if (bVar5) {
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file_01._M_len = 0x58;
        logging_function_01._M_str = "removeTx";
        logging_function_01._M_len = 8;
        LogPrintf_<unsigned_int>
                  (logging_function_01,source_file_01,0x1f1,
                   IPC|I2P|QT|COINDB|PROXY|PRUNE|REINDEX|ESTIMATEFEE|RPC|ZMQ|HTTP|MEMPOOL|TOR|NET,
                   (Level)&bucketindex_local,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
      }
    }
    if ((!inBlock) && (uVar1 = this->scale, uVar1 <= uVar10)) {
      if (uVar1 == 0) {
        __assert_fail("scale != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                      ,0x1fe,
                      "void TxConfirmStats::removeTx(unsigned int, unsigned int, unsigned int, bool)"
                     );
      }
      uVar11 = 0;
      pvVar12 = (this->failAvg).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->failAvg).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12) / 0x18;
      if ((ulong)uVar10 / (ulong)uVar1 < uVar8) {
        uVar8 = (ulong)uVar10 / (ulong)uVar1;
      }
      for (; uVar11 < uVar8; uVar11 = uVar11 + 1) {
        lVar3 = *(long *)&(pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        *(double *)(lVar3 + (ulong)bucketindex_local * 8) =
             *(double *)(lVar3 + (ulong)bucketindex_local * 8) + 1.0;
        pvVar12 = pvVar12 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_007c1ea2:
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::removeTx(unsigned int entryHeight, unsigned int nBestSeenHeight, unsigned int bucketindex, bool inBlock)
{
    //nBestSeenHeight is not updated yet for the new block
    int blocksAgo = nBestSeenHeight - entryHeight;
    if (nBestSeenHeight == 0)  // the BlockPolicyEstimator hasn't seen any blocks yet
        blocksAgo = 0;
    if (blocksAgo < 0) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;  //This can't happen because we call this with our best seen height, no entries can have higher
    }

    if (blocksAgo >= (int)unconfTxs.size()) {
        if (oldUnconfTxs[bucketindex] > 0) {
            oldUnconfTxs[bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from >25 blocks,bucketIndex=%u already\n",
                     bucketindex);
        }
    }
    else {
        unsigned int blockIndex = entryHeight % unconfTxs.size();
        if (unconfTxs[blockIndex][bucketindex] > 0) {
            unconfTxs[blockIndex][bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n",
                     blockIndex, bucketindex);
        }
    }
    if (!inBlock && (unsigned int)blocksAgo >= scale) { // Only counts as a failure if not confirmed for entire period
        assert(scale != 0);
        unsigned int periodsAgo = blocksAgo / scale;
        for (size_t i = 0; i < periodsAgo && i < failAvg.size(); i++) {
            failAvg[i][bucketindex]++;
        }
    }
}